

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

PsbtBip32DataStruct * __thiscall
cfd::api::json::PsbtBip32Data::ConvertToStruct
          (PsbtBip32DataStruct *__return_storage_ptr__,PsbtBip32Data *this)

{
  PsbtBip32DataStruct::PsbtBip32DataStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->master_fingerprint);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->path);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->descriptor);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtBip32DataStruct PsbtBip32Data::ConvertToStruct() const {  // NOLINT
  PsbtBip32DataStruct result;
  result.pubkey = pubkey_;
  result.master_fingerprint = master_fingerprint_;
  result.path = path_;
  result.descriptor = descriptor_;
  result.ignore_items = ignore_items;
  return result;
}